

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db_archive.cpp
# Opt level: O1

void __thiscall
DbArchive_WriteASingleUint64_Test::DbArchive_WriteASingleUint64_Test
          (DbArchive_WriteASingleUint64_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_00271040;
  in_memory_store::in_memory_store(&(this->super_DbArchive).store_);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_00270eb0;
  return;
}

Assistant:

TEST_F (DbArchive, WriteASingleUint64) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    std::uint64_t const original = UINT64_C (0xF0F0F0F0F0F0F0F0);

    // Write 'original' to the store using a serializer.
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    auto archive = pstore::serialize::archive::make_writer (transaction);
    auto where = pstore::typed_address<std::uint64_t>::make (db.size ());
    pstore::serialize::write (archive, original);

    // Now read that value back again using the raw pstore API and check that the round-trip was
    // successful.
    auto where2 = pstore::typed_address<std::uint64_t>::make (
        where.absolute () + pstore::calc_alignment (where.absolute (), alignof (std::uint64_t)));
    auto actual = db.getro (where2);
    EXPECT_EQ (original, *actual);
}